

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::Params::reset(Params *this)

{
  this->realNumberPrecision = 6;
  this->integerBase = 0;
  this->fieldWidth = 0;
  (this->padChar).ucs = L' ';
  this->fieldAlignment = AlignRight;
  this->realNumberNotation = SmartNotation;
  (this->numberFlags).super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
  super_QFlagsStorage<QTextStream::NumberFlag>.i = 0;
  return;
}

Assistant:

void QTextStreamPrivate::Params::reset()
{
    realNumberPrecision = 6;
    integerBase = 0;
    fieldWidth = 0;
    padChar = u' ';
    fieldAlignment = QTextStream::AlignRight;
    realNumberNotation = QTextStream::SmartNotation;
    numberFlags = { };
}